

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EdgeSensitivePathSuffixSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeSensitivePathSuffixSyntax,slang::syntax::EdgeSensitivePathSuffixSyntax_const&>
          (BumpAllocator *this,EdgeSensitivePathSuffixSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  Info *pIVar4;
  ExpressionSyntax *pEVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  EdgeSensitivePathSuffixSyntax *pEVar18;
  
  pEVar18 = (EdgeSensitivePathSuffixSyntax *)allocate(this,0x98,8);
  (pEVar18->super_PathSuffixSyntax).super_SyntaxNode.previewNode =
       (args->super_PathSuffixSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_PathSuffixSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PathSuffixSyntax).super_SyntaxNode.parent;
  (pEVar18->super_PathSuffixSyntax).super_SyntaxNode.kind =
       (args->super_PathSuffixSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar18->super_PathSuffixSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pEVar18->super_PathSuffixSyntax).super_SyntaxNode.parent = pSVar1;
  uVar7 = (args->openParen).field_0x2;
  NVar8.raw = (args->openParen).numFlags.raw;
  uVar9 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pEVar18->openParen).kind = (args->openParen).kind;
  (pEVar18->openParen).field_0x2 = uVar7;
  (pEVar18->openParen).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar18->openParen).rawLen = uVar9;
  (pEVar18->openParen).info = pIVar2;
  (pEVar18->outputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->outputs).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->outputs).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->outputs).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar18->outputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->outputs).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar18->outputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pEVar18->outputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar18->outputs).super_SyntaxListBase.childCount =
       (args->outputs).super_SyntaxListBase.childCount;
  (pEVar18->outputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005964b8;
  sVar3 = (args->outputs).elements._M_extent._M_extent_value;
  (pEVar18->outputs).elements._M_ptr = (args->outputs).elements._M_ptr;
  (pEVar18->outputs).elements._M_extent._M_extent_value = sVar3;
  uVar7 = (args->polarityOperator).field_0x2;
  NVar8.raw = (args->polarityOperator).numFlags.raw;
  uVar9 = (args->polarityOperator).rawLen;
  pIVar2 = (args->polarityOperator).info;
  TVar10 = (args->colon).kind;
  uVar11 = (args->colon).field_0x2;
  NVar12.raw = (args->colon).numFlags.raw;
  uVar13 = (args->colon).rawLen;
  pIVar4 = (args->colon).info;
  pEVar5 = (args->expr).ptr;
  TVar14 = (args->closeParen).kind;
  uVar15 = (args->closeParen).field_0x2;
  NVar16.raw = (args->closeParen).numFlags.raw;
  uVar17 = (args->closeParen).rawLen;
  (pEVar18->polarityOperator).kind = (args->polarityOperator).kind;
  (pEVar18->polarityOperator).field_0x2 = uVar7;
  (pEVar18->polarityOperator).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar18->polarityOperator).rawLen = uVar9;
  (pEVar18->polarityOperator).info = pIVar2;
  (pEVar18->colon).kind = TVar10;
  (pEVar18->colon).field_0x2 = uVar11;
  (pEVar18->colon).numFlags = (NumericTokenFlags)NVar12.raw;
  (pEVar18->colon).rawLen = uVar13;
  (pEVar18->colon).info = pIVar4;
  (pEVar18->expr).ptr = pEVar5;
  (pEVar18->closeParen).kind = TVar14;
  (pEVar18->closeParen).field_0x2 = uVar15;
  (pEVar18->closeParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (pEVar18->closeParen).rawLen = uVar17;
  (pEVar18->closeParen).info = (args->closeParen).info;
  return pEVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }